

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::InterpolateKeys
          (FBXConverter *this,aiVectorKey *valOut,KeyTimeList *keys,KeyFrameListList *inputs,
          aiVector3D *def_value,double *max_time,double *min_time)

{
  float fVar1;
  float fVar2;
  long lVar3;
  bool bVar4;
  size_type __new_size;
  reference plVar5;
  const_reference __t;
  __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var6;
  element_type *peVar7;
  reference pvVar8;
  reference pvVar9;
  __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var10;
  element_type *peVar11;
  reference pvVar12;
  __tuple_element_t<2UL,_tuple<shared_ptr<vector<long,_allocator<long>_>_>,_shared_ptr<vector<float,_allocator<float>_>_>,_unsigned_int>_>
  *p_Var13;
  double *pdVar14;
  float local_144;
  size_type local_120;
  uint local_114;
  ai_real interpValue;
  ai_real factor;
  value_type_conflict6 timeB;
  value_type_conflict6 timeA;
  value_type_conflict4 valueB;
  value_type_conflict4 valueA;
  size_t id1;
  size_t id0;
  size_t ksize;
  KeyFrameList *kfl;
  size_t i;
  float local_98;
  ai_real result [3];
  value_type_conflict6 time;
  const_iterator __end2;
  const_iterator __begin2;
  KeyTimeList *__range2;
  value_type_conflict1 local_5c;
  KeyFrameList *local_58;
  size_t count;
  vector<unsigned_int,_std::allocator<unsigned_int>_> next_pos;
  double *max_time_local;
  aiVector3D *def_value_local;
  KeyFrameListList *inputs_local;
  KeyTimeList *keys_local;
  aiVectorKey *valOut_local;
  FBXConverter *this_local;
  
  next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)max_time;
  bVar4 = std::vector<long,_std::allocator<long>_>::empty(keys);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    __assert_fail("!keys.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xcf4,
                  "void Assimp::FBX::FBXConverter::InterpolateKeys(aiVectorKey *, const KeyTimeList &, const KeyFrameListList &, const aiVector3D &, double &, double &)"
                 );
  }
  if (valOut == (aiVectorKey *)0x0) {
    __assert_fail("nullptr != valOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xcf5,
                  "void Assimp::FBX::FBXConverter::InterpolateKeys(aiVectorKey *, const KeyTimeList &, const KeyFrameListList &, const aiVector3D &, double &, double &)"
                 );
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count);
  local_58 = (KeyFrameList *)
             std::
             vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
             ::size(inputs);
  __new_size = std::
               vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ::size(inputs);
  local_5c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count,__new_size,&local_5c);
  __end2 = std::vector<long,_std::allocator<long>_>::begin(keys);
  time = (value_type_conflict6)std::vector<long,_std::allocator<long>_>::end(keys);
  keys_local = (KeyTimeList *)valOut;
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                     *)&time), bVar4) {
    plVar5 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end2);
    result._4_8_ = *plVar5;
    i._4_4_ = def_value->x;
    local_98 = def_value->y;
    result[0] = def_value->z;
    for (kfl = (KeyFrameList *)0x0; kfl < local_58;
        kfl = (KeyFrameList *)
              ((long)&(kfl->
                      super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                      ).
                      super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                      .super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1)) {
      __t = std::
            vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
            ::operator[](inputs,(size_type)kfl);
      p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                            (__t);
      peVar7 = std::
               __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      local_120 = std::vector<long,_std::allocator<long>_>::size(peVar7);
      if (local_120 != 0) {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count,
                            (size_type)kfl);
        if (*pvVar8 < local_120) {
          p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)std::
                      get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                                (__t);
          peVar7 = std::
                   __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var6);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count,
                              (size_type)kfl);
          pvVar9 = std::vector<long,_std::allocator<long>_>::at(peVar7,(ulong)*pvVar8);
          if (*pvVar9 == result._4_8_) {
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count,
                                (size_type)kfl);
            *pvVar8 = *pvVar8 + 1;
          }
        }
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count,
                            (size_type)kfl);
        if (*pvVar8 == 0) {
          local_114 = 0;
        }
        else {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count,
                              (size_type)kfl);
          local_114 = *pvVar8 - 1;
        }
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count,
                            (size_type)kfl);
        if (*pvVar8 == local_120) {
          local_120 = local_120 - 1;
        }
        else {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count,
                              (size_type)kfl);
          local_120 = (size_type)*pvVar8;
        }
        p_Var10 = (__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     get<1ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                               (__t);
        peVar11 = std::
                  __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var10);
        pvVar12 = std::vector<float,_std::allocator<float>_>::at(peVar11,(ulong)local_114);
        fVar1 = *pvVar12;
        p_Var10 = (__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     get<1ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                               (__t);
        peVar11 = std::
                  __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var10);
        pvVar12 = std::vector<float,_std::allocator<float>_>::at(peVar11,local_120);
        fVar2 = *pvVar12;
        p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                              (__t);
        peVar7 = std::
                 __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        pvVar9 = std::vector<long,_std::allocator<long>_>::at(peVar7,(ulong)local_114);
        lVar3 = *pvVar9;
        p_Var6 = (__shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    get<0ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                              (__t);
        peVar7 = std::
                 __shared_ptr_access<std::vector<long,_std::allocator<long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        pvVar9 = std::vector<long,_std::allocator<long>_>::at(peVar7,local_120);
        if (*pvVar9 == lVar3) {
          local_144 = 0.0;
        }
        else {
          local_144 = (float)(result._4_8_ - lVar3) / (float)(*pvVar9 - lVar3);
        }
        p_Var13 = std::
                  get<2ul,std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>
                            (__t);
        *(float *)((long)&i + (ulong)*p_Var13 * 4 + 4) = (fVar2 - fVar1) * local_144 + fVar1;
      }
    }
    (keys_local->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(((double)(long)result._4_8_ / 46186158000.0) * this->anim_fps);
    pdVar14 = std::min<double>(min_time,(double *)keys_local);
    *min_time = *pdVar14;
    pdVar14 = std::max<double>((double *)
                               next_pos.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (double *)keys_local);
    *(double *)
     next_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage = *pdVar14;
    *(float *)&(keys_local->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish = i._4_4_;
    *(float *)((long)&(keys_local->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_finish + 4) = local_98;
    *(ai_real *)
     &(keys_local->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = result[0];
    keys_local = keys_local + 1;
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&__end2);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&count);
  return;
}

Assistant:

void FBXConverter::InterpolateKeys(aiVectorKey* valOut, const KeyTimeList& keys, const KeyFrameListList& inputs,
            const aiVector3D& def_value,
            double& max_time,
            double& min_time) {
            ai_assert(!keys.empty());
            ai_assert(nullptr != valOut);

            std::vector<unsigned int> next_pos;
            const size_t count(inputs.size());

            next_pos.resize(inputs.size(), 0);

            for (KeyTimeList::value_type time : keys) {
                ai_real result[3] = { def_value.x, def_value.y, def_value.z };

                for (size_t i = 0; i < count; ++i) {
                    const KeyFrameList& kfl = inputs[i];

                    const size_t ksize = std::get<0>(kfl)->size();
                    if (ksize == 0) {
                        continue;
                    }
                    if (ksize > next_pos[i] && std::get<0>(kfl)->at(next_pos[i]) == time) {
                        ++next_pos[i];
                    }

                    const size_t id0 = next_pos[i] > 0 ? next_pos[i] - 1 : 0;
                    const size_t id1 = next_pos[i] == ksize ? ksize - 1 : next_pos[i];

                    // use lerp for interpolation
                    const KeyValueList::value_type valueA = std::get<1>(kfl)->at(id0);
                    const KeyValueList::value_type valueB = std::get<1>(kfl)->at(id1);

                    const KeyTimeList::value_type timeA = std::get<0>(kfl)->at(id0);
                    const KeyTimeList::value_type timeB = std::get<0>(kfl)->at(id1);

                    const ai_real factor = timeB == timeA ? ai_real(0.) : static_cast<ai_real>((time - timeA)) / (timeB - timeA);
                    const ai_real interpValue = static_cast<ai_real>(valueA + (valueB - valueA) * factor);

                    result[std::get<2>(kfl)] = interpValue;
                }

                // magic value to convert fbx times to seconds
                valOut->mTime = CONVERT_FBX_TIME(time) * anim_fps;

                min_time = std::min(min_time, valOut->mTime);
                max_time = std::max(max_time, valOut->mTime);

                valOut->mValue.x = result[0];
                valOut->mValue.y = result[1];
                valOut->mValue.z = result[2];

                ++valOut;
            }
        }